

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusBeginEnd::adjust_orig_mthd(MthdCelsiusBeginEnd *this)

{
  result_type rVar1;
  MthdCelsiusBeginEnd *this_local;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar1 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (this->super_SingleMthdTest).super_MthdTest.val & 0xf;
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    if ((rVar1 & 1) != 0) {
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                            super_RepeatTest.super_Test.rnd);
      (this->super_SingleMthdTest).super_MthdTest.val =
           1 << ((byte)rVar1 & 0x1f) ^ (this->super_SingleMthdTest).super_MthdTest.val;
    }
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.celsius_pipe_begin_end == 3)
     || ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.celsius_pipe_begin_end ==
         10)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.celsius_pipe_vtx_state =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.celsius_pipe_vtx_state &
         0x8fffffff;
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xf;
			if (rnd() & 1)
				val ^= 1 << (rnd() & 0x1f);
		}
		if (orig.celsius_pipe_begin_end == 3 || orig.celsius_pipe_begin_end == 0xa) {
			insrt(orig.celsius_pipe_vtx_state, 28, 3, 0);
		}
	}